

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setter_argument_mutator.hpp
# Opt level: O2

StringHolder *
prop::detail::SetterArgumentMutator<StringHolder,_const_char_*,_true>::adapt
          (StringHolder *__return_storage_ptr__,char **value)

{
  allocator local_31;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,*value,&local_31);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_30);
  std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

static SetterType adapt( IncomingType&& value )
  {
    return static_cast< SetterType >( std::move( value ) );
  }